

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NFA.hpp
# Opt level: O0

void __thiscall Centaurus::NFA<unsigned_char>::NFA(NFA<unsigned_char> *this,Stream *stream)

{
  CharClass<unsigned_char> local_48;
  Stream *local_18;
  Stream *stream_local;
  NFA<unsigned_char> *this_local;
  
  local_18 = stream;
  stream_local = (Stream *)this;
  NFABase<Centaurus::NFABaseState<unsigned_char,_int>_>::NFABase
            (&this->super_NFABase<Centaurus::NFABaseState<unsigned_char,_int>_>);
  (this->super_NFABase<Centaurus::NFABaseState<unsigned_char,_int>_>)._vptr_NFABase =
       (_func_int **)&PTR__NFA_0027a768;
  std::
  vector<Centaurus::NFABaseState<unsigned_char,_int>,_std::allocator<Centaurus::NFABaseState<unsigned_char,_int>_>_>
  ::emplace_back<>(&(this->super_NFABase<Centaurus::NFABaseState<unsigned_char,_int>_>).m_states);
  CharClass<unsigned_char>::CharClass(&local_48);
  add_state(this,&local_48);
  CharClass<unsigned_char>::~CharClass(&local_48);
  parse(this,local_18);
  return;
}

Assistant:

NFA(Stream& stream)
    {
        m_states.emplace_back();
        add_state(CharClass<TCHAR>());
        
        parse(stream);
    }